

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool are_equal(string_view lhs,string_view rhs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  sVar3 = lhs._M_len;
  if (rhs._M_len != sVar3) {
    return false;
  }
  bVar5 = sVar3 == 0;
  if (!bVar5) {
    sVar4 = 0;
    do {
      iVar1 = tolower((int)lhs._M_str[sVar4]);
      iVar2 = tolower((int)rhs._M_str[sVar4]);
      if (iVar1 != iVar2) {
        return false;
      }
      sVar4 = sVar4 + 1;
      bVar5 = sVar3 == sVar4;
    } while (!bVar5);
  }
  return bVar5;
}

Assistant:

constexpr bool
are_equal(const std::string_view lhs, const std::string_view rhs) noexcept
{
    if (rhs.size() != lhs.size())
        return false;

    std::string_view::size_type i = 0;
    std::string_view::size_type e = lhs.size();

    for (; i != e; ++i)
        if (std::tolower(lhs[i]) != std::tolower(rhs[i]))
            return false;

    return true;
}